

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O2

void __thiscall
booster::locale::boundary::details::
boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
::update_rule(boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              *this)

{
  element_type *peVar1;
  long lVar2;
  
  peVar1 = (this->map_->index_).
           super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  lVar2 = (long)(peVar1->
                super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if (this->current_ !=
      (long)(peVar1->
            super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
            )._M_impl.super__Vector_impl_data._M_finish - lVar2 >> 4) {
    (this->value_).rule_ = *(rule_type *)(lVar2 + 8 + this->current_ * 0x10);
  }
  return;
}

Assistant:

void update_rule()
                    {
                        if(current_ != size()) {
                            value_.rule(index()[current_].rule);
                        }
                    }